

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O3

size_t burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
                 (TSTNode<unsigned_int> *node,uchar **strings,size_t pos,size_t depth)

{
  TSTNode<unsigned_int> *pTVar1;
  void *pvVar2;
  int depth_00;
  size_t sVar3;
  long lVar4;
  void *pvVar5;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buck_2;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buck;
  
  pTVar1 = (TSTNode<unsigned_int> *)(node->buckets)._M_elems[0];
  depth_00 = (int)depth;
  if (((node->is_tst).super__Base_bitset<1UL>._M_w & 1) == 0) {
    if (pTVar1 != (TSTNode<unsigned_int> *)0x0) {
      pvVar5 = (pTVar1->buckets)._M_elems[0];
      pvVar2 = (pTVar1->buckets)._M_elems[1];
      lVar4 = (long)pvVar2 - (long)pvVar5;
      sVar3 = (long)pvVar2 - (long)pvVar5;
      if (sVar3 != 0) {
        memmove(strings + pos,pvVar5,sVar3);
        pvVar5 = (pTVar1->buckets)._M_elems[0];
      }
      lVar4 = lVar4 >> 3;
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5);
      }
      operator_delete(pTVar1);
      mkqsort(strings + pos,(int)lVar4,depth_00);
      pos = pos + lVar4;
    }
  }
  else {
    pos = burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
                    (pTVar1,strings,pos,depth);
    operator_delete(pTVar1);
  }
  pTVar1 = (TSTNode<unsigned_int> *)(node->buckets)._M_elems[1];
  if (((node->is_tst).super__Base_bitset<1UL>._M_w & 2) == 0) {
    if (pTVar1 != (TSTNode<unsigned_int> *)0x0) {
      pvVar5 = (pTVar1->buckets)._M_elems[0];
      pvVar2 = (pTVar1->buckets)._M_elems[1];
      lVar4 = (long)pvVar2 - (long)pvVar5;
      sVar3 = (long)pvVar2 - (long)pvVar5;
      if (sVar3 != 0) {
        memmove(strings + pos,pvVar5,sVar3);
        pvVar5 = (pTVar1->buckets)._M_elems[0];
      }
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5);
      }
      lVar4 = lVar4 >> 3;
      operator_delete(pTVar1);
      if ((char)node->pivot != '\0') {
        mkqsort(strings + pos,(int)lVar4,depth_00 + 4);
      }
      pos = pos + lVar4;
    }
  }
  else {
    pos = burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
                    (pTVar1,strings,pos,depth + 4);
    operator_delete(pTVar1);
  }
  pTVar1 = (TSTNode<unsigned_int> *)(node->buckets)._M_elems[2];
  if (((node->is_tst).super__Base_bitset<1UL>._M_w & 4) == 0) {
    if (pTVar1 != (TSTNode<unsigned_int> *)0x0) {
      pvVar5 = (pTVar1->buckets)._M_elems[0];
      pvVar2 = (pTVar1->buckets)._M_elems[1];
      lVar4 = (long)pvVar2 - (long)pvVar5;
      sVar3 = (long)pvVar2 - (long)pvVar5;
      if (sVar3 != 0) {
        memmove(strings + pos,pvVar5,sVar3);
        pvVar5 = (pTVar1->buckets)._M_elems[0];
      }
      lVar4 = lVar4 >> 3;
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5);
      }
      operator_delete(pTVar1);
      mkqsort(strings + pos,(int)lVar4,depth_00);
      pos = pos + lVar4;
    }
  }
  else {
    pos = burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
                    (pTVar1,strings,pos,depth);
    operator_delete(pTVar1);
  }
  return pos;
}

Assistant:

static inline size_t
burst_traverse(TSTNode<CharT>* node,
               unsigned char** strings,
               size_t pos,
               size_t depth)
{
	pos = handle_bucket<0, BucketT>(node, strings, pos, depth);
	pos = handle_bucket<1, BucketT>(node, strings, pos, depth);
	pos = handle_bucket<2, BucketT>(node, strings, pos, depth);
	return pos;
}